

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  float *pfVar1;
  ImDrawVert *pIVar2;
  ImDrawIdx IVar3;
  ImDrawIdx IVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  char cVar8;
  ImDrawIdx *pIVar9;
  ImU32 IVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ImDrawIdx IVar14;
  undefined7 in_register_00000081;
  short sVar15;
  uint uVar16;
  short sVar17;
  uint uVar18;
  ulong uVar19;
  ImDrawIdx IVar20;
  ImDrawIdx IVar21;
  ImVec2 IVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined8 uStack_a0;
  float afStack_98 [2];
  ImVec2 local_90;
  undefined1 local_88 [16];
  ulong local_78;
  ulong local_70;
  float local_64;
  uint local_60;
  undefined4 local_5c;
  ulong local_58;
  ulong local_50;
  float local_44;
  float *local_40;
  ImU32 local_34;
  
  local_88._8_8_ = local_88._0_8_;
  if (1 < points_count) {
    IVar22 = this->_Data->TexUvWhitePixel;
    local_70 = (ulong)(points_count - 1U);
    uVar5 = points_count - 1U;
    if (closed) {
      uVar5 = points_count;
    }
    local_44 = thickness;
    local_34 = col;
    if ((this->Flags & 1) == 0) {
      uStack_a0 = 0x1a2b4e;
      PrimReserve(this,uVar5 * 6,uVar5 * 4);
      if (0 < (int)uVar5) {
        fVar26 = local_44 * 0.5;
        uVar13 = CONCAT44(0,points_count);
        local_88._0_8_ = uVar13;
        uVar7 = 1;
        IVar10 = local_34;
        local_90 = IVar22;
        local_44 = fVar26;
        do {
          uVar19 = uVar7;
          if (uVar13 == uVar7) {
            uVar19 = 0;
          }
          fVar29 = points[uVar19].x - points[uVar7 - 1].x;
          fVar31 = points[uVar19].y - points[uVar7 - 1].y;
          fVar24 = fVar29 * fVar29 + fVar31 * fVar31;
          fVar25 = 1.0;
          if (0.0 < fVar24) {
            if (fVar24 < 0.0) {
              local_40 = (float *)CONCAT44(local_40._4_4_,fVar29);
              local_50 = CONCAT44(local_50._4_4_,fVar31);
              uStack_a0 = 0x1a2bef;
              fVar24 = sqrtf(fVar24);
              uVar13 = local_88._0_8_;
              IVar22 = local_90;
              fVar26 = local_44;
              fVar29 = local_40._0_4_;
              fVar31 = (float)local_50;
              IVar10 = local_34;
            }
            else {
              fVar24 = SQRT(fVar24);
            }
            fVar25 = 1.0 / fVar24;
          }
          fVar29 = fVar29 * fVar25 * fVar26;
          fVar31 = fVar31 * fVar25 * fVar26;
          pIVar2 = this->_VtxWritePtr;
          (pIVar2->pos).x = points[uVar7 - 1].x + fVar31;
          (pIVar2->pos).y = points[uVar7 - 1].y - fVar29;
          pIVar2->uv = IVar22;
          pIVar2 = this->_VtxWritePtr;
          pIVar2->col = IVar10;
          pIVar2[1].pos.x = points[uVar19].x + fVar31;
          pIVar2[1].pos.y = points[uVar19].y - fVar29;
          pIVar2[1].uv = IVar22;
          pIVar2 = this->_VtxWritePtr;
          pIVar2[1].col = IVar10;
          pIVar2[2].pos.x = points[uVar19].x - fVar31;
          pIVar2[2].pos.y = points[uVar19].y + fVar29;
          pIVar2[2].uv = IVar22;
          pIVar2 = this->_VtxWritePtr;
          pIVar2[2].col = IVar10;
          pIVar2[3].pos.x = points[uVar7 - 1].x - fVar31;
          pIVar2[3].pos.y = fVar29 + points[uVar7 - 1].y;
          pIVar2[3].uv = IVar22;
          pIVar2 = this->_VtxWritePtr;
          pIVar2[3].col = IVar10;
          this->_VtxWritePtr = pIVar2 + 4;
          uVar16 = this->_VtxCurrentIdx;
          pIVar9 = this->_IdxWritePtr;
          IVar4 = (ImDrawIdx)uVar16;
          *pIVar9 = IVar4;
          pIVar9[1] = IVar4 + 1;
          pIVar9[2] = IVar4 + 2;
          pIVar9[3] = IVar4;
          pIVar9[4] = IVar4 + 2;
          pIVar9[5] = IVar4 + 3;
          this->_IdxWritePtr = pIVar9 + 6;
          this->_VtxCurrentIdx = uVar16 + 4;
          bVar23 = uVar7 != uVar5;
          uVar7 = uVar7 + 1;
        } while (bVar23);
      }
    }
    else {
      local_5c = (undefined4)CONCAT71(in_register_00000081,closed);
      iVar11 = 0xc;
      if (1.0 < thickness) {
        iVar11 = 0x12;
      }
      local_60 = points_count * 3;
      if (1.0 < thickness) {
        local_60 = points_count * 4;
      }
      uStack_a0 = 0x1a2d7b;
      local_58 = (ulong)uVar5;
      PrimReserve(this,iVar11 * uVar5,local_60);
      lVar12 = -((ulong)(((uint)(1.0 < thickness) * 2 + 3) * points_count) * 8 + 0xf &
                0xfffffffffffffff0);
      local_40 = (float *)((long)afStack_98 + lVar12);
      uVar13 = (ulong)(uint)points_count;
      IVar10 = local_34;
      local_78 = (ulong)(uint)points_count;
      local_50 = uVar13;
      if (0 < (int)local_58) {
        uVar19 = local_58 & 0xffffffff;
        uVar7 = 1;
        do {
          uVar6 = uVar7;
          if (uVar13 == uVar7) {
            uVar6 = 0;
          }
          local_88._0_4_ = points[uVar6].x - points[uVar7 - 1].x;
          local_64 = points[uVar6].y - points[uVar7 - 1].y;
          fVar26 = (float)local_88._0_4_ * (float)local_88._0_4_ + local_64 * local_64;
          fVar29 = 1.0;
          if (0.0 < fVar26) {
            if (fVar26 < 0.0) {
              local_88 = ZEXT416((uint)local_88._0_4_);
              *(undefined8 *)((long)afStack_98 + lVar12 + -8) = 0x1a2e2f;
              fVar26 = sqrtf(fVar26);
              uVar13 = local_50;
              IVar10 = local_34;
            }
            else {
              fVar26 = SQRT(fVar26);
            }
            fVar29 = 1.0 / fVar26;
          }
          local_40[uVar7 * 2 + -2] = local_64 * fVar29;
          local_40[uVar7 * 2 + -1] = -(float)local_88._0_4_ * fVar29;
          bVar23 = uVar7 != uVar19;
          uVar7 = uVar7 + 1;
        } while (bVar23);
      }
      pfVar1 = local_40 + uVar13 * 2;
      cVar8 = (char)local_5c;
      if (cVar8 == '\0') {
        *(undefined8 *)(pfVar1 + -2) = *(undefined8 *)(pfVar1 + -4);
      }
      uVar5 = IVar10 & 0xffffff;
      if (local_44 <= 1.0) {
        if (cVar8 == '\0') {
          fVar26 = *local_40;
          fVar29 = local_40[1];
          fVar31 = points->x;
          fVar24 = points->y;
          *pfVar1 = fVar26 + fVar31;
          pfVar1[1] = fVar29 + fVar24;
          pfVar1[2] = fVar31 - fVar26;
          pfVar1[3] = fVar24 - fVar29;
          uVar7 = local_70 & 0xffffffff;
          fVar26 = points[uVar7].x;
          fVar29 = points[uVar7].y;
          uVar19 = (ulong)(uint)((int)local_70 * 2);
          *(ulong *)(pfVar1 + uVar19 * 2) =
               CONCAT44(local_40[uVar7 * 2 + 1] + fVar29,local_40[uVar7 * 2] + fVar26);
          *(ulong *)(pfVar1 + uVar19 * 2 + 2) =
               CONCAT44(fVar29 - local_40[uVar7 * 2 + 1],fVar26 - local_40[uVar7 * 2]);
        }
        if (0 < (int)local_58) {
          pIVar9 = this->_IdxWritePtr;
          uVar7 = 1;
          lVar12 = 0;
          uVar16 = this->_VtxCurrentIdx;
          do {
            bVar23 = uVar13 * 0x18 + -0x18 == lVar12;
            uVar19 = uVar7 & 0xffffffff;
            if (bVar23) {
              uVar19 = 0;
            }
            uVar18 = uVar16 + 3;
            if (bVar23) {
              uVar18 = this->_VtxCurrentIdx;
            }
            fVar26 = (local_40[uVar7 * 2 + -2] + local_40[uVar19 * 2]) * 0.5;
            fVar29 = (local_40[uVar7 * 2 + -1] + local_40[uVar19 * 2 + 1]) * 0.5;
            fVar31 = fVar26 * fVar26 + fVar29 * fVar29;
            if (1e-06 < fVar31) {
              fVar31 = 1.0 / fVar31;
              fVar24 = 100.0;
              if (fVar31 <= 100.0) {
                fVar24 = fVar31;
              }
              fVar26 = fVar26 * fVar24;
              fVar29 = fVar29 * fVar24;
            }
            fVar31 = points[uVar19].x;
            fVar24 = points[uVar19].y;
            uVar19 = (ulong)(uint)((int)uVar19 * 2);
            *(ulong *)(pfVar1 + uVar19 * 2) = CONCAT44(fVar29 + fVar24,fVar31 + fVar26);
            *(ulong *)(pfVar1 + uVar19 * 2 + 2) = CONCAT44(fVar24 - fVar29,fVar31 - fVar26);
            sVar17 = (short)uVar18;
            *(short *)((long)pIVar9 + lVar12) = sVar17;
            sVar15 = (short)uVar16;
            *(short *)((long)pIVar9 + lVar12 + 2) = sVar15;
            *(short *)((long)pIVar9 + lVar12 + 4) = sVar15 + 2;
            *(short *)((long)pIVar9 + lVar12 + 6) = sVar15 + 2;
            *(short *)((long)pIVar9 + lVar12 + 8) = sVar17 + 2;
            *(short *)((long)pIVar9 + lVar12 + 10) = sVar17;
            *(short *)((long)pIVar9 + lVar12 + 0xc) = sVar17 + 1;
            *(short *)((long)pIVar9 + lVar12 + 0xe) = sVar15 + 1;
            *(short *)((long)pIVar9 + lVar12 + 0x10) = sVar15;
            *(short *)((long)pIVar9 + lVar12 + 0x12) = sVar15;
            *(short *)((long)pIVar9 + lVar12 + 0x14) = sVar17;
            *(short *)((long)pIVar9 + lVar12 + 0x16) = sVar17 + 1;
            uVar7 = uVar7 + 1;
            lVar12 = lVar12 + 0x18;
            uVar16 = uVar18;
          } while ((local_58 & 0xffffffff) * 0x18 != lVar12);
          this->_IdxWritePtr = (ImDrawIdx *)((long)pIVar9 + lVar12);
          uVar13 = local_50;
          IVar10 = local_34;
        }
        uVar7 = 1;
        if (1 < (int)local_78) {
          uVar7 = local_78 & 0xffffffff;
        }
        lVar12 = 0;
        do {
          this->_VtxWritePtr->pos = *(ImVec2 *)((long)&points->x + lVar12);
          this->_VtxWritePtr->uv = IVar22;
          pIVar2 = this->_VtxWritePtr;
          pIVar2->col = IVar10;
          pIVar2[1].pos = *(ImVec2 *)((long)local_40 + lVar12 * 2 + uVar13 * 8);
          this->_VtxWritePtr[1].uv = IVar22;
          pIVar2 = this->_VtxWritePtr;
          pIVar2[1].col = uVar5;
          pIVar2[2].pos = *(ImVec2 *)((long)local_40 + lVar12 * 2 + uVar13 * 8 + 8);
          this->_VtxWritePtr[2].uv = IVar22;
          pIVar2 = this->_VtxWritePtr;
          pIVar2[2].col = uVar5;
          this->_VtxWritePtr = pIVar2 + 3;
          lVar12 = lVar12 + 8;
        } while (uVar7 * 8 != lVar12);
      }
      else {
        fVar26 = (local_44 + -1.0) * 0.5;
        if (cVar8 == '\0') {
          fVar24 = fVar26 + 1.0;
          fVar28 = fVar24 * *local_40;
          fVar30 = fVar24 * local_40[1];
          fVar29 = points->x;
          fVar31 = points->y;
          fVar25 = *local_40 * fVar26;
          fVar27 = local_40[1] * fVar26;
          *pfVar1 = fVar28 + fVar29;
          pfVar1[1] = fVar30 + fVar31;
          pfVar1[2] = fVar25 + fVar29;
          pfVar1[3] = fVar27 + fVar31;
          pfVar1[4] = fVar29 - fVar25;
          pfVar1[5] = fVar31 - fVar27;
          pfVar1[6] = fVar29 - fVar28;
          pfVar1[7] = fVar31 - fVar30;
          uVar7 = local_70 & 0xffffffff;
          fVar29 = points[uVar7].x;
          fVar31 = points[uVar7].y;
          uVar19 = (ulong)(uint)((int)local_70 << 2);
          *(ulong *)(pfVar1 + uVar19 * 2) =
               CONCAT44(local_40[uVar7 * 2 + 1] * fVar24 + fVar31,
                        local_40[uVar7 * 2] * fVar24 + fVar29);
          *(ulong *)(pfVar1 + uVar19 * 2 + 2) =
               CONCAT44(local_40[uVar7 * 2 + 1] * fVar26 + fVar31,
                        local_40[uVar7 * 2] * fVar26 + fVar29);
          *(ulong *)(pfVar1 + uVar19 * 2 + 4) =
               CONCAT44(fVar31 - local_40[uVar7 * 2 + 1] * fVar26,
                        fVar29 - local_40[uVar7 * 2] * fVar26);
          *(ulong *)(pfVar1 + uVar19 * 2 + 6) =
               CONCAT44(fVar31 - fVar24 * local_40[uVar7 * 2 + 1],
                        fVar29 - local_40[uVar7 * 2] * fVar24);
        }
        if (0 < (int)local_58) {
          pIVar9 = this->_IdxWritePtr;
          uVar7 = 1;
          uVar16 = this->_VtxCurrentIdx;
          do {
            uVar19 = uVar7 & 0xffffffff;
            if (uVar13 == uVar7) {
              uVar19 = 0;
            }
            uVar18 = uVar16 + 4;
            if (uVar13 == uVar7) {
              uVar18 = this->_VtxCurrentIdx;
            }
            fVar29 = (local_40[uVar7 * 2 + -2] + local_40[uVar19 * 2]) * 0.5;
            fVar31 = (local_40[uVar7 * 2 + -1] + local_40[uVar19 * 2 + 1]) * 0.5;
            fVar24 = fVar29 * fVar29 + fVar31 * fVar31;
            if (1e-06 < fVar24) {
              fVar24 = 1.0 / fVar24;
              fVar25 = 100.0;
              if (fVar24 <= 100.0) {
                fVar25 = fVar24;
              }
              fVar29 = fVar29 * fVar25;
              fVar31 = fVar31 * fVar25;
            }
            fVar27 = (fVar26 + 1.0) * fVar29;
            fVar28 = (fVar26 + 1.0) * fVar31;
            fVar24 = points[uVar19].x;
            fVar25 = points[uVar19].y;
            uVar13 = (ulong)(uint)((int)uVar19 * 4);
            *(ulong *)(pfVar1 + uVar13 * 2) = CONCAT44(fVar25 + fVar28,fVar24 + fVar27);
            *(ulong *)(pfVar1 + uVar13 * 2 + 2) =
                 CONCAT44(fVar25 + fVar31 * fVar26,fVar24 + fVar26 * fVar29);
            *(ulong *)(pfVar1 + uVar13 * 2 + 4) =
                 CONCAT44(fVar25 - fVar31 * fVar26,fVar24 - fVar26 * fVar29);
            *(ulong *)(pfVar1 + uVar13 * 2 + 6) = CONCAT44(fVar25 - fVar28,fVar24 - fVar27);
            IVar4 = (ImDrawIdx)uVar18;
            IVar20 = IVar4 + 1;
            *pIVar9 = IVar20;
            IVar3 = (ImDrawIdx)uVar16;
            pIVar9[1] = IVar3 + 1;
            IVar21 = IVar3 + 2;
            pIVar9[2] = IVar21;
            pIVar9[3] = IVar21;
            IVar14 = IVar4 + 2;
            pIVar9[4] = IVar14;
            pIVar9[5] = IVar20;
            pIVar9[6] = IVar20;
            pIVar9[7] = IVar3 + 1;
            pIVar9[8] = IVar3;
            pIVar9[9] = IVar3;
            pIVar9[10] = IVar4;
            pIVar9[0xb] = IVar20;
            pIVar9[0xc] = IVar14;
            pIVar9[0xd] = IVar21;
            pIVar9[0xe] = IVar3 + 3;
            pIVar9[0xf] = IVar3 + 3;
            pIVar9[0x10] = IVar4 + 3;
            pIVar9[0x11] = IVar14;
            pIVar9 = pIVar9 + 0x12;
            bVar23 = uVar7 != (local_58 & 0xffffffff);
            uVar7 = uVar7 + 1;
            uVar13 = local_50;
            uVar16 = uVar18;
          } while (bVar23);
          this->_IdxWritePtr = pIVar9;
          IVar10 = local_34;
        }
        uVar7 = 1;
        if (1 < (int)local_78) {
          uVar7 = local_78 & 0xffffffff;
        }
        lVar12 = 0;
        do {
          this->_VtxWritePtr->pos = *(ImVec2 *)((long)local_40 + lVar12 + uVar13 * 8);
          this->_VtxWritePtr->uv = IVar22;
          pIVar2 = this->_VtxWritePtr;
          pIVar2->col = uVar5;
          pIVar2[1].pos = *(ImVec2 *)((long)local_40 + lVar12 + uVar13 * 8 + 8);
          this->_VtxWritePtr[1].uv = IVar22;
          pIVar2 = this->_VtxWritePtr;
          pIVar2[1].col = IVar10;
          pIVar2[2].pos = *(ImVec2 *)((long)local_40 + lVar12 + uVar13 * 8 + 0x10);
          this->_VtxWritePtr[2].uv = IVar22;
          pIVar2 = this->_VtxWritePtr;
          pIVar2[2].col = IVar10;
          pIVar2[3].pos = *(ImVec2 *)((long)local_40 + lVar12 + uVar13 * 8 + 0x18);
          this->_VtxWritePtr[3].uv = IVar22;
          pIVar2 = this->_VtxWritePtr;
          pIVar2[3].col = uVar5;
          this->_VtxWritePtr = pIVar2 + 4;
          lVar12 = lVar12 + 0x20;
        } while (uVar7 * 0x20 != lVar12);
      }
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + (local_60 & 0xffff);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    int count = points_count;
    if (!closed)
        count = points_count-1;

    const bool thick_line = thickness > 1.0f;
    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        const int idx_count = thick_line ? count*18 : count*12;
        const int vtx_count = thick_line ? points_count*4 : points_count*3;
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * (thick_line ? 5 : 3) * sizeof(ImVec2));
        ImVec2* temp_points = temp_normals + points_count;

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            ImVec2 diff = points[i2] - points[i1];
            diff *= ImInvLength(diff, 1.0f);
            temp_normals[i1].x = diff.y;
            temp_normals[i1].y = -diff.x;
        }
        if (!closed)
            temp_normals[points_count-1] = temp_normals[points_count-2];

        if (!thick_line)
        {
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * AA_SIZE;
                temp_points[1] = points[0] - temp_normals[0] * AA_SIZE;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * AA_SIZE;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * AA_SIZE;
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+3;

                // Average normals
                ImVec2 dm = (temp_normals[i1] + temp_normals[i2]) * 0.5f;
                float dmr2 = dm.x*dm.x + dm.y*dm.y;
                if (dmr2 > 0.000001f)
                {
                    float scale = 1.0f / dmr2;
                    if (scale > 100.0f) scale = 100.0f;
                    dm *= scale;
                }
                dm *= AA_SIZE;
                temp_points[i2*2+0] = points[i2] + dm;
                temp_points[i2*2+1] = points[i2] - dm;

                // Add indexes
                _IdxWritePtr[0] = (ImDrawIdx)(idx2+0); _IdxWritePtr[1] = (ImDrawIdx)(idx1+0); _IdxWritePtr[2] = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3] = (ImDrawIdx)(idx1+2); _IdxWritePtr[4] = (ImDrawIdx)(idx2+2); _IdxWritePtr[5] = (ImDrawIdx)(idx2+0);
                _IdxWritePtr[6] = (ImDrawIdx)(idx2+1); _IdxWritePtr[7] = (ImDrawIdx)(idx1+1); _IdxWritePtr[8] = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9] = (ImDrawIdx)(idx1+0); _IdxWritePtr[10]= (ImDrawIdx)(idx2+0); _IdxWritePtr[11]= (ImDrawIdx)(idx2+1);
                _IdxWritePtr += 12;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = points[i];          _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
                _VtxWritePtr[1].pos = temp_points[i*2+0]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;
                _VtxWritePtr[2].pos = temp_points[i*2+1]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr += 3;
            }
        }
        else
        {
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+0] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+1] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+2] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+3] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+4;

                // Average normals
                ImVec2 dm = (temp_normals[i1] + temp_normals[i2]) * 0.5f;
                float dmr2 = dm.x*dm.x + dm.y*dm.y;
                if (dmr2 > 0.000001f)
                {
                    float scale = 1.0f / dmr2;
                    if (scale > 100.0f) scale = 100.0f;
                    dm *= scale;
                }
                ImVec2 dm_out = dm * (half_inner_thickness + AA_SIZE);
                ImVec2 dm_in = dm * half_inner_thickness;
                temp_points[i2*4+0] = points[i2] + dm_out;
                temp_points[i2*4+1] = points[i2] + dm_in;
                temp_points[i2*4+2] = points[i2] - dm_in;
                temp_points[i2*4+3] = points[i2] - dm_out;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1+2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2+2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1+0); _IdxWritePtr[10] = (ImDrawIdx)(idx2+0); _IdxWritePtr[11] = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2+2); _IdxWritePtr[13] = (ImDrawIdx)(idx1+2); _IdxWritePtr[14] = (ImDrawIdx)(idx1+3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1+3); _IdxWritePtr[16] = (ImDrawIdx)(idx2+3); _IdxWritePtr[17] = (ImDrawIdx)(idx2+2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i*4+0]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i*4+1]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i*4+2]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i*4+3]; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Stroke
        const int idx_count = count*6;
        const int vtx_count = count*4;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];
            ImVec2 diff = p2 - p1;
            diff *= ImInvLength(diff, 1.0f);

            const float dx = diff.x * (thickness * 0.5f);
            const float dy = diff.y * (thickness * 0.5f);
            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx+2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx+3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}